

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodeList.c
# Opt level: O0

unsigned_long ixmlNodeList_length(IXML_NodeList *nList)

{
  undefined8 local_20;
  unsigned_long length;
  IXML_NodeList *list;
  IXML_NodeList *nList_local;
  
  local_20 = 0;
  for (length = (unsigned_long)nList; length != 0; length = *(unsigned_long *)(length + 8)) {
    local_20 = local_20 + 1;
  }
  return local_20;
}

Assistant:

unsigned long ixmlNodeList_length(IXML_NodeList *nList)
{
	IXML_NodeList *list;
	unsigned long length = 0lu;

	list = nList;
	while (list != NULL) {
		++length;
		list = list->next;
	}

	return length;
}